

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O0

timer_thread_stats_t __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
query_timer_thread_stats
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
           *this)

{
  timer_thread_stats_t tVar1;
  int iVar2;
  pointer ptVar3;
  undefined4 extraout_var;
  size_t extraout_RDX;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
  *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&(this->m_sync_objects).m_lock);
  ptVar3 = std::unique_ptr<so_5::timer_manager_t,_std::default_delete<so_5::timer_manager_t>_>::
           operator->(&this->m_timer_manager);
  iVar2 = (*ptVar3->_vptr_timer_manager_t[7])();
  tVar1.m_single_shot_count._4_4_ = extraout_var;
  tVar1.m_single_shot_count._0_4_ = iVar2;
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  tVar1.m_periodic_count = extraout_RDX;
  return tVar1;
}

Assistant:

timer_thread_stats_t
env_infrastructure_t< ACTIVITY_TRACKER >::query_timer_thread_stats()
	{
		std::lock_guard< std::mutex > lock( m_sync_objects.m_lock );

		return m_timer_manager->query_stats();
	}